

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>,_true>
 __thiscall
duckdb::
make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalArrowBatchCollector,duckdb::PreparedStatementData&,unsigned_long&>
          (duckdb *this,PreparedStatementData *args,unsigned_long *args_1)

{
  _func_int **pp_Var1;
  PhysicalBatchCollector *this_00;
  
  this_00 = (PhysicalBatchCollector *)operator_new(0x138);
  pp_Var1 = (_func_int **)*args_1;
  PhysicalBatchCollector::PhysicalBatchCollector(this_00,args);
  (this_00->super_PhysicalResultCollector).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalResultCollector_0249e968;
  this_00[1].super_PhysicalResultCollector.super_PhysicalOperator._vptr_PhysicalOperator = pp_Var1;
  *(PhysicalBatchCollector **)this = this_00;
  return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
          )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
            )this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}